

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O1

int uv_fs_poll_start(uv_fs_poll_t *handle,uv_fs_poll_cb cb,char *path,uint interval)

{
  uint *puVar1;
  uint uVar2;
  uv_loop_t *loop;
  int iVar3;
  size_t sVar4;
  undefined8 *puVar5;
  uint64_t uVar6;
  
  iVar3 = 0;
  if ((handle->flags & 0x4000) == 0) {
    loop = handle->loop;
    sVar4 = strlen(path);
    puVar5 = (undefined8 *)calloc(1,sVar4 + 0x2b0);
    if (puVar5 != (undefined8 *)0x0) {
      puVar5[3] = loop;
      puVar5[4] = cb;
      *(uint *)((long)puVar5 + 0xc) = interval + (interval == 0);
      uVar6 = uv_now(loop);
      puVar5[2] = uVar6;
      *puVar5 = handle;
      memcpy(puVar5 + 0x55,path,sVar4 + 1);
      iVar3 = uv_timer_init(loop,(uv_timer_t *)(puVar5 + 5));
      if (iVar3 == 0) {
        uVar2 = *(uint *)(puVar5 + 0xb);
        *(uint *)(puVar5 + 0xb) = uVar2 | 0x8000;
        if (((uVar2 >> 0xd & 1) != 0) &&
           (*(uint *)(puVar5 + 0xb) = uVar2 & 0xffffdfff | 0x8000, (uVar2 >> 0xe & 1) != 0)) {
          *(int *)(puVar5[7] + 8) = *(int *)(puVar5[7] + 8) + -1;
        }
        iVar3 = uv_fs_stat(loop,(uv_fs_t *)(puVar5 + 0x15),(char *)(puVar5 + 0x55),poll_cb);
        if (iVar3 == 0) {
          handle->poll_ctx = puVar5;
          uVar2 = handle->flags;
          if (((uVar2 >> 0xe & 1) == 0) && (handle->flags = uVar2 | 0x4000, (uVar2 >> 0xd & 1) != 0)
             ) {
            puVar1 = &handle->loop->active_handles;
            *puVar1 = *puVar1 + 1;
          }
          return 0;
        }
      }
      abort();
    }
    iVar3 = -0xc;
  }
  return iVar3;
}

Assistant:

int uv_fs_poll_start(uv_fs_poll_t* handle,
                     uv_fs_poll_cb cb,
                     const char* path,
                     unsigned int interval) {
  struct poll_ctx* ctx;
  uv_loop_t* loop;
  size_t len;

  if (uv__is_active(handle))
    return 0;

  loop = handle->loop;
  len = strlen(path);
  ctx = calloc(1, sizeof(*ctx) + len);

  if (ctx == NULL)
    return UV_ENOMEM;

  ctx->loop = loop;
  ctx->poll_cb = cb;
  ctx->interval = interval ? interval : 1;
  ctx->start_time = uv_now(loop);
  ctx->parent_handle = handle;
  memcpy(ctx->path, path, len + 1);

  if (uv_timer_init(loop, &ctx->timer_handle))
    abort();

  ctx->timer_handle.flags |= UV__HANDLE_INTERNAL;
  uv__handle_unref(&ctx->timer_handle);

  if (uv_fs_stat(loop, &ctx->fs_req, ctx->path, poll_cb))
    abort();

  handle->poll_ctx = ctx;
  uv__handle_start(handle);

  return 0;
}